

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

string * Vault::operator+(string *__return_storage_ptr__,string *string,
                         Tiny<Vault::SecretVersionDetail,_long> *tiny)

{
  string local_40;
  Tiny<Vault::SecretVersionDetail,_long> *local_20;
  Tiny<Vault::SecretVersionDetail,_long> *tiny_local;
  string *string_local;
  
  local_20 = tiny;
  tiny_local = (Tiny<Vault::SecretVersionDetail,_long> *)string;
  string_local = __return_storage_ptr__;
  Tiny<Vault::SecretVersionDetail,long>::toString_abi_cxx11_(&local_40,tiny);
  std::operator+(__return_storage_ptr__,string,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string operator+(const std::string &string, const Tiny &tiny) {
    return string + tiny.toString();
  }